

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Vec2f __thiscall embree::XMLLoader::load<embree::Vec2<float>>(XMLLoader *this,Ref<embree::XML> *xml)

{
  Token *this_00;
  Vec2f VVar1;
  runtime_error *this_01;
  long *in_RDX;
  float fVar2;
  float fVar3;
  undefined4 extraout_XMM0_Db;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this_00 = *(Token **)(*in_RDX + 0x98);
  if (*(long *)(*in_RDX + 0xa0) - (long)this_00 == 0x90) {
    fVar2 = Token::Float(this_00,true);
    fVar3 = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x48),true);
    *(float *)&(this->path).filename._M_dataplus._M_p = fVar2;
    *(float *)((long)&(this->path).filename._M_dataplus._M_p + 4) = fVar3;
    VVar1.field_0.field_0.y = (float)extraout_XMM0_Db;
    VVar1.field_0.field_0.x = fVar3;
    return (Vec2f)VVar1.field_0;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_(&local_58,(ParseLocation *)(*in_RDX + 0x10));
  std::operator+(&local_38,&local_58,": wrong float2 body");
  std::runtime_error::runtime_error(this_01,(string *)&local_38);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Vec2f XMLLoader::load<Vec2f>(const Ref<XML>& xml) {
    if (xml->body.size() != 2) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong float2 body");
    return Vec2f(xml->body[0].Float(),xml->body[1].Float());
  }